

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.h
# Opt level: O2

void stats_sample_value(stats_t *stats,double x)

{
  unsigned_long uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  stats->_sum = stats->_sum + x;
  if (stats->_n == 0) {
    stats->_min = x;
    stats->_max = x;
  }
  else {
    uVar2 = -(ulong)(stats->_min < x);
    uVar3 = -(ulong)(x < stats->_max);
    stats->_min = (double)(~uVar2 & (ulong)x | (ulong)stats->_min & uVar2);
    stats->_max = (double)(~uVar3 & (ulong)x | (ulong)stats->_max & uVar3);
  }
  uVar1 = stats->_n + 1;
  stats->_n = uVar1;
  dVar4 = x - stats->_mean;
  auVar6._8_4_ = (int)(uVar1 >> 0x20);
  auVar6._0_8_ = uVar1;
  auVar6._12_4_ = 0x45300000;
  dVar5 = dVar4 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) + stats->_mean;
  stats->_mean = dVar5;
  stats->_M2 = (x - dVar5) * dVar4 + stats->_M2;
  return;
}

Assistant:

static inline void stats_sample_value(stats_t *stats, const double x) {
    double delta = 0;

    /* extra stats */
    stats->_sum = stats->_sum + x;
    if (0UL == stats->_n) {
        stats->_min = x;
        stats->_max = x;
    }
    else {
        stats->_min = stats->_min < x ? stats->_min : x;
        stats->_max = stats->_max > x ? stats->_max : x;
    }

    stats->_n = stats->_n + 1UL;
    delta = x - stats->_mean;
    stats->_mean = stats->_mean + delta/stats->_n;
    stats->_M2 = stats->_M2 + delta * (x - stats->_mean);
}